

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O2

void Abc_ObjSortByDelay(Abc_IffMan_t *p,Abc_Obj_t *pObj,int fDelay1,Abc_Obj_t **ppNodes)

{
  float fVar1;
  undefined1 auVar2 [16];
  Abc_Obj_t *pAVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  
  lVar6 = 0;
  while (lVar5 = lVar6, lVar5 < (pObj->vFanins).nSize) {
    pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
    lVar6 = lVar5 + 1;
    ppNodes[lVar5] = pAVar3;
    uVar4 = *(uint *)&pAVar3->field_0x14 & 0xf;
    if ((uVar4 != 2) && (uVar4 != 5)) {
      for (; 0 < lVar5; lVar5 = lVar5 + -1) {
        fVar7 = Abc_IffDelay(p,ppNodes[lVar5 + -1],fDelay1);
        fVar1 = p->pPars->pLutDelays[lVar5 + -1];
        fVar8 = Abc_IffDelay(p,ppNodes[lVar5],fDelay1);
        if (fVar7 + fVar1 < fVar8 + p->pPars->pLutDelays[lVar5]) {
          auVar2 = *(undefined1 (*) [16])(ppNodes + lVar5 + -1);
          auVar9._0_8_ = auVar2._8_8_;
          auVar9._8_4_ = auVar2._0_4_;
          auVar9._12_4_ = auVar2._4_4_;
          *(undefined1 (*) [16])(ppNodes + lVar5 + -1) = auVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_ObjSortByDelay( Abc_IffMan_t * p, Abc_Obj_t * pObj, int fDelay1, Abc_Obj_t ** ppNodes )
{
    Abc_Obj_t * pFanin;
    int i, a, k = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        ppNodes[k++] = pFanin;
        if ( Abc_ObjIsCi(pFanin) )
            continue;
        for ( a = k-1; a > 0; a-- )
            if ( Abc_IffDelay(p, ppNodes[a-1], fDelay1) + p->pPars->pLutDelays[a-1] < Abc_IffDelay(p, ppNodes[a], fDelay1) + p->pPars->pLutDelays[a] )
                ABC_SWAP( Abc_Obj_t *, ppNodes[a-1], ppNodes[a] );
    }
/*
    for ( a = 1; a < k; a++ )
    {
        float D1 = Abc_IffDelay(p, ppNodes[a-1], fDelay1);
        float D2 = Abc_IffDelay(p, ppNodes[a], fDelay1);
        if ( Abc_ObjIsCi(ppNodes[a-1]) || Abc_ObjIsCi(ppNodes[a]) )
            continue;
        assert( Abc_IffDelay(p, ppNodes[a-1], fDelay1) + p->pPars->pLutDelays[a-1] >= Abc_IffDelay(p, ppNodes[a], fDelay1) + p->pPars->pLutDelays[a] - 0.01 );
    }
*/
}